

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

_Bool is_delimiter(char character)

{
  undefined1 local_9;
  char character_local;
  
  if (((((character == '\"') || (character == '(')) || (character == ')')) ||
      (((character == '/' || (character == ':')) ||
       ((character == ';' || ((character == '<' || (character == '=')))))))) ||
     ((character == '>' ||
      (((((character == '?' || (character == '@')) || (character == '[')) ||
        ((character == '\\' || (character == ']')))) || ((character == '{' || (character == '}')))))
      ))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool is_delimiter(char character)
{
	if ((character == '"') ||
	    (character == '(') ||
	    (character == ')') ||
	    (character == '/') ||
	    (character == ':') ||
	    (character == ';') ||
	    (character == '<') ||
	    (character == '=') ||
	    (character == '>') ||
	    (character == '?') ||
	    (character == '@') ||
	    (character == '[') ||
	    (character == '\\') ||
	    (character == ']') ||
	    (character == '{') ||
	    (character == '}')) {
		return true;
	}

	return false;
}